

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void QHashPrivate::Node<QWindow*,QGuiApplicationPrivate::SynthesizedMouseData>::
     createInPlace<QGuiApplicationPrivate::SynthesizedMouseData_const&>
               (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *n,QWindow **k,
               SynthesizedMouseData *args)

{
  SynthesizedMouseData *in_RDX;
  SynthesizedMouseData *in_RSI;
  qreal *in_RDI;
  
  *in_RDI = (in_RSI->pos).xp;
  QGuiApplicationPrivate::SynthesizedMouseData::SynthesizedMouseData(in_RSI,in_RDX);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }